

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void disas_simd_scalar_two_reg_misc(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx;
  bool bVar1;
  _Bool _Var2;
  uintptr_t o_3;
  TCGTemp *pTVar3;
  TCGv_i64 tcg_dest;
  TCGv_i32 v;
  TCGv_i32 pTVar4;
  uint opcode;
  uintptr_t o_5;
  uint uVar5;
  uintptr_t o_1;
  code *func;
  int iVar6;
  uint32_t target_el;
  uint rn;
  MemOp memop;
  uintptr_t o_4;
  uintptr_t o_2;
  uint size;
  uintptr_t o;
  TCGTemp *args [2];
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  TCGv_i32 local_80;
  TCGv_i32 local_58;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGv_i32 local_38;
  
  opcode = insn >> 0xc & 0x1f;
  if (0x1c < opcode - 3) goto switchD_006af922_caseD_4;
  tcg_ctx = s->uc->tcg_ctx;
  rn = insn & 0x1f;
  size = insn >> 5 & 0x1f;
  memop = insn >> 0x16 & MO_64;
  uVar5 = insn & 0x20000000;
  iVar6 = 0xd82ec8;
  switch(opcode) {
  case 3:
    if (s->fp_access_checked == true) goto LAB_006aff1f;
    s->fp_access_checked = true;
    target_el = s->fp_excp_el;
    if (target_el == 0) {
      handle_2misc_satacc(s,true,uVar5 != 0,false,memop,size,rn);
      return;
    }
    goto LAB_006afb86;
  case 4:
  case 5:
  case 6:
  case 0x10:
  case 0x11:
  case 0x13:
  case 0x15:
  case 0x1e:
    goto switchD_006af922_caseD_4;
  case 7:
    goto switchD_006af922_caseD_7;
  case 8:
  case 9:
  case 0xb:
    goto switchD_006af922_caseD_8;
  case 10:
    break;
  default:
    opcode = uVar5 >> 0x17 | insn >> 0x12 & 0x20 | opcode;
    memop = ((insn >> 0x16 & 1) != 0) + MO_32;
    bVar1 = true;
    iVar6 = 4;
    if (opcode < 0x3f) {
      if (0x2b < opcode) {
        if (opcode - 0x2c < 3) {
LAB_006afa11:
          handle_2misc_fcmp_zero
                    (s,opcode,true,true,SUB41(memop,0),size,rn,in_stack_ffffffffffffff70);
          return;
        }
        if (1 < opcode - 0x3a) {
          if (opcode != 0x3d) goto switchD_006af922_caseD_4;
          goto LAB_006afd79;
        }
        goto switchD_006af977_caseD_5a;
      }
      if (opcode - 0x1a < 2) goto switchD_006af977_caseD_5a;
      if (opcode != 0x1c) {
        if (opcode != 0x1d) goto switchD_006af922_caseD_4;
        goto switchD_006af977_caseD_5d;
      }
    }
    else {
      if (opcode < 0x6c) {
        switch(opcode) {
        case 0x56:
          if ((insn >> 0x16 & 1) == 0) goto switchD_006af922_caseD_4;
          _Var2 = fp_access_check(s);
          if (!_Var2) {
            return;
          }
          opcode = 0x56;
          memop = MO_32;
          goto LAB_006afaff;
        case 0x57:
        case 0x58:
        case 0x59:
          goto switchD_006af922_caseD_4;
        case 0x5a:
        case 0x5b:
          goto switchD_006af977_caseD_5a;
        case 0x5c:
          goto switchD_006af977_caseD_5c;
        case 0x5d:
switchD_006af977_caseD_5d:
          if (s->fp_access_checked == true) goto LAB_006aff1f;
          s->fp_access_checked = true;
          target_el = s->fp_excp_el;
          if (target_el == 0) {
            handle_simd_intfp_conv(s,rn,size,1,(uint)(opcode == 0x1d),0,memop);
            return;
          }
          goto LAB_006afb86;
        default:
          if (opcode != 0x3f) goto switchD_006af922_caseD_4;
LAB_006afd79:
          if (s->fp_access_checked == true) goto LAB_006aff1f;
          s->fp_access_checked = true;
          target_el = s->fp_excp_el;
          if (target_el == 0) {
            handle_2misc_reciprocal
                      (s,opcode,true,true,SUB41(memop,0),size,rn,in_stack_ffffffffffffff70);
            return;
          }
          goto LAB_006afb86;
        }
      }
      if (opcode - 0x6c < 2) goto LAB_006afa11;
      if (1 < opcode - 0x7a) {
        if (opcode != 0x7d) goto switchD_006af922_caseD_4;
        goto LAB_006afd79;
      }
switchD_006af977_caseD_5a:
      iVar6 = (insn >> 0x17 & 1) + (insn >> 0xc & 1) * 2;
    }
    goto switchD_006af977_caseD_5c;
  case 0x12:
    if (uVar5 == 0) goto switchD_006af922_caseD_4;
  case 0x14:
    if (memop == MO_64) goto switchD_006af922_caseD_4;
    if (s->fp_access_checked == true) goto LAB_006aff1f;
    s->fp_access_checked = true;
    target_el = s->fp_excp_el;
    if (target_el == 0) {
LAB_006afaff:
      handle_2misc_narrow(s,true,opcode,uVar5 != 0,false,memop,size,rn);
      return;
    }
    goto LAB_006afb86;
  }
  if (uVar5 != 0) goto switchD_006af922_caseD_4;
switchD_006af922_caseD_8:
  if (memop != MO_64) {
switchD_006af922_caseD_4:
    unallocated_encoding_aarch64(s);
    return;
  }
  memop = MO_64;
switchD_006af922_caseD_7:
  bVar1 = false;
switchD_006af977_caseD_5c:
  if (s->fp_access_checked == true) {
LAB_006aff1f:
    __assert_fail("!s->fp_access_checked",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x487,"_Bool fp_access_check(DisasContext *)");
  }
  s->fp_access_checked = true;
  target_el = s->fp_excp_el;
  if (target_el != 0) {
LAB_006afb86:
    gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,target_el);
    return;
  }
  if (bVar1) {
    iVar6 = arm_rmode_to_sf_aarch64(iVar6);
    local_58 = tcg_const_i32_aarch64(tcg_ctx,iVar6);
    pTVar3 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
    local_80 = (TCGv_i32)((long)pTVar3 - (long)tcg_ctx);
    tcg_gen_addi_i64_aarch64(tcg_ctx,(TCGv_i64)local_80,(TCGv_i64)tcg_ctx->cpu_env,0x2ec8);
    local_48 = (TCGTemp *)(local_58 + (long)tcg_ctx);
    local_40 = pTVar3;
    tcg_gen_callN_aarch64(tcg_ctx,helper_set_rmode_aarch64,local_48,2,&local_48);
  }
  else {
    local_80 = (TCGv_i32)0x0;
    local_58 = (TCGv_i32)0x0;
  }
  if (memop == MO_64) {
    tcg_dest = read_fp_dreg(s,size);
    pTVar3 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
    handle_2misc_64(s,opcode,uVar5 != 0,(TCGv_i64)((long)pTVar3 - (long)tcg_ctx),tcg_dest,local_80,
                    (TCGv_ptr)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    write_fp_dreg_aarch64(s,rn,(TCGv_i64)((long)pTVar3 - (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,pTVar3);
    goto LAB_006afec0;
  }
  pTVar3 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
  tcg_dest = (TCGv_i64)((long)pTVar3 - (long)tcg_ctx);
  pTVar3 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
  v = (TCGv_i32)((long)pTVar3 - (long)tcg_ctx);
  read_vec_element_i32(s,(TCGv_i32)tcg_dest,size,0,memop);
  if (opcode < 0x3c) {
    if ((0xc0000001c000000U >> ((ulong)opcode & 0x3f) & 1) != 0) {
      pTVar4 = tcg_const_i32_aarch64(tcg_ctx,0);
      func = helper_vfp_tosls_aarch64;
      goto LAB_006afe80;
    }
    if ((ulong)opcode != 7) goto LAB_006afe19;
    (**(code **)((long)disas_simd_scalar_two_reg_misc::fns[memop] + (ulong)(uVar5 >> 0x1a)))
              (tcg_ctx,v,tcg_ctx->cpu_env,tcg_dest);
  }
  else {
LAB_006afe19:
    if ((0x21 < opcode - 0x5a) || ((0x300000007U >> ((ulong)(opcode - 0x5a) & 0x3f) & 1) == 0)) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                 ,0x28a4,(char *)0x0);
    }
    pTVar4 = tcg_const_i32_aarch64(tcg_ctx,0);
    func = helper_vfp_touls_aarch64;
LAB_006afe80:
    local_38 = local_80 + (long)&tcg_ctx->pool_cur;
    local_48 = (TCGTemp *)((long)tcg_ctx + (long)tcg_dest);
    local_40 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
    tcg_gen_callN_aarch64(tcg_ctx,func,(TCGTemp *)((long)tcg_ctx + (long)v),3,&local_48);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
  }
  write_fp_sreg(s,rn,v);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(v + (long)tcg_ctx));
LAB_006afec0:
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(tcg_dest + (long)tcg_ctx));
  if (bVar1) {
    pTVar3 = (TCGTemp *)(local_58 + (long)tcg_ctx);
    local_48 = pTVar3;
    local_40 = (TCGTemp *)(local_80 + (long)tcg_ctx);
    tcg_gen_callN_aarch64(tcg_ctx,helper_set_rmode_aarch64,pTVar3,2,&local_48);
    tcg_temp_free_internal_aarch64(tcg_ctx,pTVar3);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(local_80 + (long)tcg_ctx));
  }
  return;
}

Assistant:

static void disas_simd_scalar_two_reg_misc(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int opcode = extract32(insn, 12, 5);
    int size = extract32(insn, 22, 2);
    bool u = extract32(insn, 29, 1);
    bool is_fcvt = false;
    int rmode;
    TCGv_i32 tcg_rmode;
    TCGv_ptr tcg_fpstatus;

    switch (opcode) {
    case 0x3: /* USQADD / SUQADD*/
        if (!fp_access_check(s)) {
            return;
        }
        handle_2misc_satacc(s, true, u, false, size, rn, rd);
        return;
    case 0x7: /* SQABS / SQNEG */
        break;
    case 0xa: /* CMLT */
        if (u) {
            unallocated_encoding(s);
            return;
        }
        /* fall through */
    case 0x8: /* CMGT, CMGE */
    case 0x9: /* CMEQ, CMLE */
    case 0xb: /* ABS, NEG */
        if (size != 3) {
            unallocated_encoding(s);
            return;
        }
        break;
    case 0x12: /* SQXTUN */
        if (!u) {
            unallocated_encoding(s);
            return;
        }
        /* fall through */
    case 0x14: /* SQXTN, UQXTN */
        if (size == 3) {
            unallocated_encoding(s);
            return;
        }
        if (!fp_access_check(s)) {
            return;
        }
        handle_2misc_narrow(s, true, opcode, u, false, size, rn, rd);
        return;
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1f:
        /* Floating point: U, size[1] and opcode indicate operation;
         * size[0] indicates single or double precision.
         */
        opcode |= (extract32(size, 1, 1) << 5) | (u << 6);
        size = extract32(size, 0, 1) ? 3 : 2;
        switch (opcode) {
        case 0x2c: /* FCMGT (zero) */
        case 0x2d: /* FCMEQ (zero) */
        case 0x2e: /* FCMLT (zero) */
        case 0x6c: /* FCMGE (zero) */
        case 0x6d: /* FCMLE (zero) */
            handle_2misc_fcmp_zero(s, opcode, true, u, true, size, rn, rd);
            return;
        case 0x1d: /* SCVTF */
        case 0x5d: /* UCVTF */
        {
            bool is_signed = (opcode == 0x1d);
            if (!fp_access_check(s)) {
                return;
            }
            handle_simd_intfp_conv(s, rd, rn, 1, is_signed, 0, size);
            return;
        }
        case 0x3d: /* FRECPE */
        case 0x3f: /* FRECPX */
        case 0x7d: /* FRSQRTE */
            if (!fp_access_check(s)) {
                return;
            }
            handle_2misc_reciprocal(s, opcode, true, u, true, size, rn, rd);
            return;
        case 0x1a: /* FCVTNS */
        case 0x1b: /* FCVTMS */
        case 0x3a: /* FCVTPS */
        case 0x3b: /* FCVTZS */
        case 0x5a: /* FCVTNU */
        case 0x5b: /* FCVTMU */
        case 0x7a: /* FCVTPU */
        case 0x7b: /* FCVTZU */
            is_fcvt = true;
            rmode = extract32(opcode, 5, 1) | (extract32(opcode, 0, 1) << 1);
            break;
        case 0x1c: /* FCVTAS */
        case 0x5c: /* FCVTAU */
            /* TIEAWAY doesn't fit in the usual rounding mode encoding */
            is_fcvt = true;
            rmode = FPROUNDING_TIEAWAY;
            break;
        case 0x56: /* FCVTXN, FCVTXN2 */
            if (size == 2) {
                unallocated_encoding(s);
                return;
            }
            if (!fp_access_check(s)) {
                return;
            }
            handle_2misc_narrow(s, true, opcode, u, false, size - 1, rn, rd);
            return;
        default:
            unallocated_encoding(s);
            return;
        }
        break;
    default:
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    if (is_fcvt) {
        tcg_rmode = tcg_const_i32(tcg_ctx, arm_rmode_to_sf(rmode));
        tcg_fpstatus = get_fpstatus_ptr(tcg_ctx, false);
        gen_helper_set_rmode(tcg_ctx, tcg_rmode, tcg_rmode, tcg_fpstatus);
    } else {
        tcg_rmode = NULL;
        tcg_fpstatus = NULL;
    }

    if (size == 3) {
        TCGv_i64 tcg_rn = read_fp_dreg(s, rn);
        TCGv_i64 tcg_rd = tcg_temp_new_i64(tcg_ctx);

        handle_2misc_64(s, opcode, u, tcg_rd, tcg_rn, tcg_rmode, tcg_fpstatus);
        write_fp_dreg(s, rd, tcg_rd);
        tcg_temp_free_i64(tcg_ctx, tcg_rd);
        tcg_temp_free_i64(tcg_ctx, tcg_rn);
    } else {
        TCGv_i32 tcg_rn = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 tcg_rd = tcg_temp_new_i32(tcg_ctx);

        read_vec_element_i32(s, tcg_rn, rn, 0, size);

        switch (opcode) {
        case 0x7: /* SQABS, SQNEG */
        {
            NeonGenOneOpEnvFn *genfn;
            static NeonGenOneOpEnvFn * const fns[3][2] = {
                { gen_helper_neon_qabs_s8, gen_helper_neon_qneg_s8 },
                { gen_helper_neon_qabs_s16, gen_helper_neon_qneg_s16 },
                { gen_helper_neon_qabs_s32, gen_helper_neon_qneg_s32 },
            };
            genfn = fns[size][u];
            genfn(tcg_ctx, tcg_rd, tcg_ctx->cpu_env, tcg_rn);
            break;
        }
        case 0x1a: /* FCVTNS */
        case 0x1b: /* FCVTMS */
        case 0x1c: /* FCVTAS */
        case 0x3a: /* FCVTPS */
        case 0x3b: /* FCVTZS */
        {
            TCGv_i32 tcg_shift = tcg_const_i32(tcg_ctx, 0);
            gen_helper_vfp_tosls(tcg_ctx, tcg_rd, tcg_rn, tcg_shift, tcg_fpstatus);
            tcg_temp_free_i32(tcg_ctx, tcg_shift);
            break;
        }
        case 0x5a: /* FCVTNU */
        case 0x5b: /* FCVTMU */
        case 0x5c: /* FCVTAU */
        case 0x7a: /* FCVTPU */
        case 0x7b: /* FCVTZU */
        {
            TCGv_i32 tcg_shift = tcg_const_i32(tcg_ctx, 0);
            gen_helper_vfp_touls(tcg_ctx, tcg_rd, tcg_rn, tcg_shift, tcg_fpstatus);
            tcg_temp_free_i32(tcg_ctx, tcg_shift);
            break;
        }
        default:
            g_assert_not_reached();
        }

        write_fp_sreg(s, rd, tcg_rd);
        tcg_temp_free_i32(tcg_ctx, tcg_rd);
        tcg_temp_free_i32(tcg_ctx, tcg_rn);
    }

    if (is_fcvt) {
        gen_helper_set_rmode(tcg_ctx, tcg_rmode, tcg_rmode, tcg_fpstatus);
        tcg_temp_free_i32(tcg_ctx, tcg_rmode);
        tcg_temp_free_ptr(tcg_ctx, tcg_fpstatus);
    }
}